

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O1

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseImplicitTypeDefsCtx::makeTypeUse
          (Result<wasm::Ok> *__return_storage_ptr__,ParseImplicitTypeDefsCtx *this,Index pos,
          optional<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT>
          param_2,ParamsT *params,ResultsT *results)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pNVar2;
  ulong *puVar3;
  void *pvVar4;
  vector<wasm::HeapType,std::allocator<wasm::HeapType>> *this_00;
  iterator __position;
  Signature sig;
  Result<wasm::Ok> *pRVar5;
  pointer pTVar6;
  pointer pTVar7;
  long lVar8;
  undefined8 *puVar9;
  Type *__args;
  pointer pNVar10;
  ulong *puVar11;
  ulong uVar12;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::Signature,_wasm::HeapType>,_false,_true>,_bool>
  pVar13;
  Err local_120;
  Type local_100;
  Type local_f8;
  ulong *local_f0;
  Lexer *local_e8;
  long local_e0;
  ulong local_d8;
  string local_d0;
  Result<wasm::Ok> *local_b0;
  undefined1 auStack_a8 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> resultTypes;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_88;
  long lStack_70;
  Index IStack_68;
  undefined4 uStack_64;
  HeapType type;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_50;
  ParseImplicitTypeDefsCtx *local_38;
  
  local_88.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  resultTypes.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = pos;
  local_38 = this;
  if (params != (ParamsT *)0x0) {
    _IStack_68 = 0;
    type.id = 0;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::reserve
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&stack0xffffffffffffff98,
               ((long)(params->super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(params->super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>).
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    pNVar10 = (params->super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pNVar2 = (params->super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pNVar10 != pNVar2) {
      __args = &pNVar10->type;
      do {
        if (type.id == 0) {
          std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type_const&>
                    ((vector<wasm::Type,std::allocator<wasm::Type>> *)&stack0xffffffffffffff98,
                     (iterator)0x0,__args);
        }
        else {
          *(uintptr_t *)type.id = __args->id;
          type.id = type.id + 8;
        }
        pNVar10 = (pointer)(__args + 1);
        __args = __args + 3;
      } while (pNVar10 != pNVar2);
    }
    pTVar7 = local_88.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pTVar6 = local_88.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_88.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)_IStack_68;
    local_88.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)type.id;
    local_88.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    _IStack_68 = 0;
    type.id = 0;
    if (pTVar6 != (pointer)0x0) {
      operator_delete(pTVar6,(long)pTVar7 - (long)pTVar6);
    }
    if ((pointer)_IStack_68 != (pointer)0x0) {
      operator_delete((void *)_IStack_68,-_IStack_68);
    }
  }
  auStack_a8 = (undefined1  [8])0x0;
  resultTypes.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  resultTypes.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (results != (ResultsT *)0x0) {
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::operator=
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_a8,results);
  }
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&stack0xffffffffffffff98,&local_88);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
            (&local_50,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_a8);
  local_e8 = &local_38->in;
  puVar9 = (undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
  lVar8 = 0;
  uVar12 = 0;
  do {
    local_d8 = uVar12;
    local_e0 = lVar8;
    puVar3 = *(ulong **)((long)&type.id + local_e0);
    for (puVar11 = *(ulong **)((long)&stack0xffffffffffffff98 + local_e0);
        local_b0 = __return_storage_ptr__, puVar11 != puVar3; puVar11 = puVar11 + 1) {
      uVar12 = *puVar11;
      local_f0 = puVar3;
      if (uVar12 < 2 || (uVar12 & 1) != 0 && 6 < uVar12) {
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,"tuple types not allowed in signature","");
        Lexer::err(&local_120,local_e8,&local_d0);
        *(undefined8 **)
         &(local_b0->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar9;
        paVar1 = &local_120.msg.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120.msg._M_dataplus._M_p == paVar1) {
          *puVar9 = CONCAT71(local_120.msg.field_2._M_allocated_capacity._1_7_,
                             local_120.msg.field_2._M_local_buf[0]);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
               local_120.msg.field_2._8_8_;
        }
        else {
          *(pointer *)
           &(local_b0->val).super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_120.msg._M_dataplus._M_p;
          *(ulong *)((long)&(local_b0->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
               CONCAT71(local_120.msg.field_2._M_allocated_capacity._1_7_,
                        local_120.msg.field_2._M_local_buf[0]);
        }
        *(size_type *)
         ((long)&(local_b0->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) =
             local_120.msg._M_string_length;
        local_120.msg._M_string_length = 0;
        local_120.msg.field_2._M_local_buf[0] = '\0';
        *(__index_type *)
         ((long)&(local_b0->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
        uVar12 = local_d8;
        local_120.msg._M_dataplus._M_p = (pointer)paVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          uVar12 = local_d8;
        }
        goto LAB_00bd434c;
      }
    }
    lVar8 = local_e0 + 0x18;
    uVar12 = CONCAT71((int7)((ulong)puVar11 >> 8),lVar8 == 0x30);
  } while (lVar8 != 0x30);
LAB_00bd434c:
  pRVar5 = local_b0;
  lVar8 = 0x30;
  do {
    pvVar4 = *(void **)((long)&local_88.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                               _M_impl.super__Vector_impl_data._M_finish + lVar8);
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,*(long *)((long)&lStack_70 + lVar8) - (long)pvVar4);
    }
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != 0);
  if ((uVar12 & 1) != 0) {
    wasm::Type::Type(&local_100,&local_88);
    wasm::Type::Type(&local_f8,(Tuple *)auStack_a8);
    sig.results.id = local_f8.id;
    sig.params.id = local_100.id;
    _IStack_68 = local_100.id;
    type.id = local_f8.id;
    pVar13 = std::
             _Hashtable<wasm::Signature,std::pair<wasm::Signature_const,wasm::HeapType>,std::allocator<std::pair<wasm::Signature_const,wasm::HeapType>>,std::__detail::_Select1st,std::equal_to<wasm::Signature>,std::hash<wasm::Signature>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
             ::_M_emplace<std::pair<wasm::Signature_const,wasm::HeapType>>
                       ((_Hashtable<wasm::Signature,std::pair<wasm::Signature_const,wasm::HeapType>,std::allocator<std::pair<wasm::Signature_const,wasm::HeapType>>,std::__detail::_Select1st,std::equal_to<wasm::Signature>,std::hash<wasm::Signature>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                         *)&local_38->sigTypes);
    if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      HeapType::HeapType((HeapType *)&stack0xffffffffffffff98,sig);
      *(uintptr_t *)
       ((long)pVar13.first.
              super__Node_iterator_base<std::pair<const_wasm::Signature,_wasm::HeapType>,_true>.
              _M_cur.
              super__Node_iterator_base<std::pair<const_wasm::Signature,_wasm::HeapType>,_true> +
       0x18) = _IStack_68;
      this_00 = (vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)local_38->types;
      __position._M_current = *(HeapType **)(this_00 + 8);
      if (__position._M_current == *(HeapType **)(this_00 + 0x10)) {
        std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
        _M_realloc_insert<wasm::HeapType_const&>
                  (this_00,__position,(HeapType *)&stack0xffffffffffffff98);
      }
      else {
        (__position._M_current)->id = _IStack_68;
        *(HeapType **)(this_00 + 8) = __position._M_current + 1;
      }
    }
    IStack_68 = resultTypes.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_;
    type.id = *(uintptr_t *)
               ((long)pVar13.first.
                      super__Node_iterator_base<std::pair<const_wasm::Signature,_wasm::HeapType>,_true>
                      ._M_cur.
                      super__Node_iterator_base<std::pair<const_wasm::Signature,_wasm::HeapType>,_true>
               + 0x18);
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::HeapType>,std::allocator<std::pair<unsigned_int_const,wasm::HeapType>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<unsigned_int_const,wasm::HeapType>>(local_38->implicitTypes);
    *(__index_type *)
     ((long)&(pRVar5->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
  }
  if (auStack_a8 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_a8,
                    (long)resultTypes.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)auStack_a8);
  }
  if (local_88.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return pRVar5;
}

Assistant:

Result<TypeUseT> makeTypeUse(Index pos,
                               std::optional<HeapTypeT>,
                               ParamsT* params,
                               ResultsT* results) {
    std::vector<Type> paramTypes;
    if (params) {
      paramTypes = getUnnamedTypes(*params);
    }

    std::vector<Type> resultTypes;
    if (results) {
      resultTypes = *results;
    }

    for (auto& v : {paramTypes, resultTypes}) {
      for (auto t : v) {
        if (!t.isSingle()) {
          return in.err("tuple types not allowed in signature");
        }
      }
    }

    auto sig = Signature(Type(paramTypes), Type(resultTypes));
    auto [it, inserted] = sigTypes.insert({sig, HeapType(HeapType::func)});
    if (inserted) {
      auto type = HeapType(sig);
      it->second = type;
      types.push_back(type);
    }
    implicitTypes.insert({pos, it->second});

    return Ok{};
  }